

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O2

SDKConnection * __thiscall MyServer::OnIncomingConnection(MyServer *this,TonkAddress *address)

{
  shared_ptr<MyServerConnection> ptr;
  MyServer *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  MyServer *local_18;
  
  local_18 = this;
  std::make_shared<MyServerConnection,MyServer*>(&local_28);
  tonk::SDKConnectionList<MyServerConnection>::Insert
            (&this->ConnectionList,(SDKConnection *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (SDKConnection *)local_28;
}

Assistant:

tonk::SDKConnection* MyServer::OnIncomingConnection(
    const TonkAddress& address ///< Address of the client requesting a connection
)
{
    auto ptr = std::make_shared<MyServerConnection>(this);

    // Insert into connection list to prevent it from going out of scope
    ConnectionList.Insert(ptr.get());

    return ptr.get();
}